

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

void __thiscall QAction::setIconVisibleInMenu(QAction *this,bool visible)

{
  ushort uVar1;
  QActionPrivate *this_00;
  char cVar2;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  uVar1 = *(ushort *)&this_00->field_0x188;
  if ((uVar1 & 0x600) != 0x600 && ((uVar1 & 0x600) == 0) != visible) {
    return;
  }
  *(ushort *)&this_00->field_0x188 = uVar1 & 63999 | (ushort)visible << 9;
  if (((uVar1 & 0x600) == 0x600) &&
     (cVar2 = QCoreApplication::testAttribute(AA_DontShowIconsInMenus), (bool)cVar2 == visible)) {
    return;
  }
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setIconVisibleInMenu(bool visible)
{
    Q_D(QAction);
    if (d->iconVisibleInMenu == -1 || visible != bool(d->iconVisibleInMenu)) {
        int oldValue = d->iconVisibleInMenu;
        d->iconVisibleInMenu = visible;
        // Only send data changed if we really need to.
        if (oldValue != -1
            || visible == !QCoreApplication::testAttribute(Qt::AA_DontShowIconsInMenus)) {
            d->sendDataChanged();
        }
    }
}